

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

Vec_Int_t * Fra_OneHotCompute(Fra_Man_t *p,Fra_Sml_t *pSim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  int local_40;
  int nTruePis;
  int k;
  int i;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Vec_Int_t *vOneHots;
  int fSkipConstEqu;
  Fra_Sml_t *pSim_local;
  Fra_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(pSim->pAig);
  iVar2 = Aig_ManRegNum(pSim->pAig);
  iVar1 = iVar1 - iVar2;
  if (pSim->pAig != p->pManAig) {
    __assert_fail("pSim->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                  ,0x8d,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
  }
  p_00 = Vec_IntAlloc(100);
  iVar2 = Aig_ManCiNum(pSim->pAig);
  iVar3 = Aig_ManRegNum(pSim->pAig);
  nTruePis = iVar2 - iVar3;
  do {
    iVar2 = Vec_PtrSize(pSim->pAig->vCis);
    if (iVar2 <= nTruePis) {
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pSim->pAig->vCis,nTruePis);
    iVar2 = Fra_OneHotNodeIsConst(pSim,pObj);
    if (iVar2 == 0) {
      local_40 = nTruePis;
      if (nTruePis - iVar1 < 0) {
        __assert_fail("i-nTruePis >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                      ,0x93,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
      }
      while( true ) {
        local_40 = local_40 + 1;
        iVar2 = Vec_PtrSize(pSim->pAig->vCis);
        if (iVar2 <= local_40) break;
        pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pSim->pAig->vCis,local_40);
        iVar2 = Fra_OneHotNodeIsConst(pSim,pObj_00);
        if ((iVar2 == 0) && (iVar2 = Fra_OneHotNodesAreEqual(pSim,pObj,pObj_00), iVar2 == 0)) {
          if (local_40 - iVar1 < 0) {
            __assert_fail("k-nTruePis >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                          ,0x9c,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
          }
          iVar2 = Fra_OneHotNodesAreClause(pSim,pObj,pObj_00,1,1);
          if (iVar2 == 0) {
            iVar2 = Fra_OneHotNodesAreClause(pSim,pObj,pObj_00,0,1);
            if (iVar2 == 0) {
              iVar2 = Fra_OneHotNodesAreClause(pSim,pObj,pObj_00,1,0);
              if (iVar2 != 0) {
                iVar2 = Fra_RegToLit(nTruePis - iVar1,1);
                Vec_IntPush(p_00,iVar2);
                iVar2 = Fra_RegToLit(local_40 - iVar1,0);
                Vec_IntPush(p_00,iVar2);
              }
            }
            else {
              iVar2 = Fra_RegToLit(nTruePis - iVar1,0);
              Vec_IntPush(p_00,iVar2);
              iVar2 = Fra_RegToLit(local_40 - iVar1,1);
              Vec_IntPush(p_00,iVar2);
            }
          }
          else {
            iVar2 = Fra_RegToLit(nTruePis - iVar1,1);
            Vec_IntPush(p_00,iVar2);
            iVar2 = Fra_RegToLit(local_40 - iVar1,1);
            Vec_IntPush(p_00,iVar2);
          }
        }
      }
    }
    nTruePis = nTruePis + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Fra_OneHotCompute( Fra_Man_t * p, Fra_Sml_t * pSim )
{
    int fSkipConstEqu = 1;
    Vec_Int_t * vOneHots;
    Aig_Obj_t * pObj1, * pObj2;
    int i, k;
    int nTruePis = Aig_ManCiNum(pSim->pAig) - Aig_ManRegNum(pSim->pAig);
    assert( pSim->pAig == p->pManAig );
    vOneHots = Vec_IntAlloc( 100 );
    Aig_ManForEachLoSeq( pSim->pAig, pObj1, i )
    {
        if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj1) )
            continue;
        assert( i-nTruePis >= 0 );
//        Aig_ManForEachLoSeq( pSim->pAig, pObj2, k )
//        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vPis, pObj2, k, Aig_ManCiNum(p)-Aig_ManRegNum(p) )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vCis, pObj2, k, i+1 )
        {
            if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj2) )
                continue;
            if ( fSkipConstEqu && Fra_OneHotNodesAreEqual( pSim, pObj1, pObj2 ) )
                continue;
            assert( k-nTruePis >= 0 );
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 0, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 0) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 0 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 0) );
                continue;
            }
        }
    }
    return vOneHots;
}